

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpn.cpp
# Opt level: O0

void rpn_SizeOfSection(Expression *expr,char *sectionName)

{
  bool bVar1;
  int iVar2;
  Section *sect;
  char *pcVar3;
  int *piVar4;
  size_t sVar5;
  uint8_t *puVar6;
  uint8_t *ptr;
  size_t nameLen;
  int size;
  Expression *_expr;
  Section *section;
  char *sectionName_local;
  Expression *expr_local;
  
  rpn_Init(expr);
  sect = sect_FindSectionByName(sectionName);
  if ((sect == (Section *)0x0) || (bVar1 = sect_IsSizeKnown(sect), !bVar1)) {
    expr->isKnown = false;
    pcVar3 = (char *)malloc(0x80);
    expr->reason = pcVar3;
    if (expr->reason == (char *)0x0) {
      piVar4 = __errno_location();
      pcVar3 = strerror(*piVar4);
      fatalerror("Can\'t allocate err string: %s\n",pcVar3);
    }
    iVar2 = snprintf(expr->reason,0x80,"Section \"%s\"\'s size is not known",sectionName);
    if (0x7f < iVar2) {
      pcVar3 = (char *)realloc(expr->reason,(long)(iVar2 + 1));
      expr->reason = pcVar3;
      if (expr->reason == (char *)0x0) {
        piVar4 = __errno_location();
        pcVar3 = strerror(*piVar4);
        fatalerror("Can\'t allocate err string: %s\n",pcVar3);
      }
      sprintf(expr->reason,"Section \"%s\"\'s size is not known",sectionName);
    }
    sVar5 = strlen(sectionName);
    iVar2 = (int)(sVar5 + 1);
    puVar6 = reserveSpace(expr,iVar2 + 1);
    expr->rpnPatchSize = expr->rpnPatchSize + iVar2 + 1;
    *puVar6 = 'S';
    memcpy(puVar6 + 1,sectionName,sVar5 + 1);
  }
  else {
    expr->val = sect->size;
  }
  return;
}

Assistant:

void rpn_SizeOfSection(struct Expression *expr, char const *sectionName)
{
	rpn_Init(expr);

	struct Section *section = sect_FindSectionByName(sectionName);

	if (section && sect_IsSizeKnown(section)) {
		expr->val = section->size;
	} else {
		makeUnknown(expr, "Section \"%s\"'s size is not known", sectionName);

		size_t nameLen = strlen(sectionName) + 1; // Room for NUL!
		uint8_t *ptr = reserveSpace(expr, nameLen + 1);

		expr->rpnPatchSize += nameLen + 1;
		*ptr++ = RPN_SIZEOF_SECT;
		memcpy(ptr, sectionName, nameLen);
	}
}